

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  unsigned_long *puVar1;
  Diagnostic *pDVar2;
  Definition *this_00;
  long lVar3;
  function_ref<void_(const_slang::ast::PortConnection_&)> cb;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar4;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>::templated_iterator<const_slang::ast::InstanceBodySymbol_*>,_bool>
  pVar5;
  string_view sVar6;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  TimeTraceScope timeScope;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:269:33)>
  local_40;
  
  if ((*this->numErrors <= (ulong)this->errorLimit) && (this->hierarchyProblem == false)) {
    sVar6._M_str = "AST Instance";
    sVar6._M_len = 0xc;
    detail.callable = (intptr_t)&local_40;
    detail.callback =
         function_ref<std::__cxx11::string()>::
         callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda()_1_>
    ;
    local_40.func.this = (DiagnosticVisitor *)symbol;
    TimeTraceScope::TimeTraceScope(&timeScope,sVar6,detail);
    local_40.func.this = (DiagnosticVisitor *)InstanceSymbol::getDefinition(symbol);
    puVar1 = ska::
             flat_hash_map<const_slang::ast::Definition_*,_unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>,_std::equal_to<const_slang::ast::Definition_*>,_std::allocator<std::pair<const_slang::ast::Definition_*,_unsigned_long>_>_>
             ::operator[](&this->instanceCount,(Definition **)&local_40);
    *puVar1 = *puVar1 + 1;
    sVar4 = Compilation::getAttributes(this->compilation,symbol);
    for (lVar3 = 0; sVar4.size_ << 3 != lVar3; lVar3 = lVar3 + 8) {
      AttributeSymbol::getValue(*(AttributeSymbol **)((long)sVar4.data_ + lVar3));
    }
    cb.callable = (intptr_t)&local_40;
    cb.callback = function_ref<void(slang::ast::PortConnection_const&)>::
                  callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda(auto:1&)_1_>
    ;
    local_40.func.this = this;
    InstanceSymbol::forEachPortConnection(symbol,cb);
    local_40.func.this = (DiagnosticVisitor *)symbol->body;
    pVar5 = ska::detailv3::
            sherwood_v3_table<slang::ast::InstanceBodySymbol_const*,slang::ast::InstanceBodySymbol_const*,slang::Hasher<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::InstanceBodySymbol_const*>>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::InstanceBodySymbol_const*>>,std::allocator<slang::ast::InstanceBodySymbol_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>>>
            ::emplace<slang::ast::InstanceBodySymbol_const*>
                      ((sherwood_v3_table<slang::ast::InstanceBodySymbol_const*,slang::ast::InstanceBodySymbol_const*,slang::Hasher<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::InstanceBodySymbol_const*>>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::InstanceBodySymbol_const*>>,std::allocator<slang::ast::InstanceBodySymbol_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>>>
                        *)&this->activeInstanceBodies,(InstanceBodySymbol **)&local_40);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pDVar2 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                              (DiagCode)0x8000d,
                              (symbol->super_InstanceSymbolBase).super_Symbol.location);
      Diagnostic::operator<<(pDVar2,(symbol->super_InstanceSymbolBase).super_Symbol.name);
      this->hierarchyProblem = true;
    }
    else {
      local_40.valid = true;
      local_40.func.symbol = symbol;
      if ((ulong)(this->compilation->options).maxInstanceDepth <
          (this->activeInstanceBodies).
          super_sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
          .num_elements) {
        local_40.func.this = this;
        pDVar2 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                                (DiagCode)0xc000d,
                                (symbol->super_InstanceSymbolBase).super_Symbol.location);
        this_00 = InstanceSymbol::getDefinition(symbol);
        sVar6 = Definition::getKindString(this_00);
        Diagnostic::operator<<(pDVar2,sVar6);
        Diagnostic::operator<<(pDVar2,(this->compilation->options).maxInstanceDepth);
        this->hierarchyProblem = true;
      }
      else {
        local_40.func.this = this;
        handleDefault<slang::ast::InstanceBodySymbol>(this,symbol->body);
      }
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/ElabVisitors.h:269:33)>
      ::~ScopeGuard(&local_40);
    }
    TimeTraceScope::~TimeTraceScope(&timeScope);
  }
  return;
}

Assistant:

void handle(const InstanceSymbol& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return;

        TimeTraceScope timeScope("AST Instance", [&] {
            std::string buffer;
            symbol.getHierarchicalPath(buffer);
            return buffer;
        });

        instanceCount[&symbol.getDefinition()]++;

        for (auto attr : compilation.getAttributes(symbol))
            attr->getValue();

        symbol.forEachPortConnection([&](auto& conn) {
            conn.getExpression();
            conn.checkSimulatedNetTypes();
            for (auto attr : compilation.getAttributes(conn))
                attr->getValue();
        });

        // Detect infinite recursion, which happens if we see this exact
        // instance body somewhere higher up in the stack.
        if (!activeInstanceBodies.emplace(&symbol.body).second) {
            symbol.getParentScope()->addDiag(diag::InfinitelyRecursiveHierarchy, symbol.location)
                << symbol.name;
            hierarchyProblem = true;
            return;
        }

        // In order to avoid "effectively infinite" recursions, where parameter values
        // are changing but the numbers are so huge that we would run for almost forever,
        // check the depth and bail out after a certain configurable point.
        auto guard = ScopeGuard([this, &symbol] { activeInstanceBodies.erase(&symbol.body); });
        if (activeInstanceBodies.size() > compilation.getOptions().maxInstanceDepth) {
            auto& diag = symbol.getParentScope()->addDiag(diag::MaxInstanceDepthExceeded,
                                                          symbol.location);
            diag << symbol.getDefinition().getKindString();
            diag << compilation.getOptions().maxInstanceDepth;
            hierarchyProblem = true;
            return;
        }

        visit(symbol.body);
    }